

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcxtexture.cpp
# Opt level: O3

void __thiscall
FPCXTexture::ReadPCX24bits(FPCXTexture *this,BYTE *dst,FileReader *lump,PCXHeader *hdr,int planes)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  byte bVar6;
  int iVar7;
  WORD WVar8;
  BYTE *pBVar9;
  ulong uVar10;
  byte *pbVar11;
  
  uVar10 = lump->Length - 0x80;
  pbVar1 = (byte *)operator_new__(uVar10);
  (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,pbVar1,uVar10);
  WVar8 = (this->super_FTexture).Height;
  if (WVar8 != 0) {
    iVar2 = 0;
    iVar7 = 0;
    uVar5 = 0;
    bVar6 = 0;
    pbVar4 = pbVar1;
    do {
      if (0 < planes) {
        uVar10 = 0;
        pBVar9 = dst;
        do {
          uVar3 = (uint)hdr->bytesPerScanLine;
          if (hdr->bytesPerScanLine != 0) {
            pbVar11 = pBVar9 + (int)((uint)(this->super_FTexture).Width * iVar2);
            do {
              if (iVar7 == 0) {
                bVar6 = *pbVar4;
                if (bVar6 < 0xc0) {
                  pbVar4 = pbVar4 + 1;
                  iVar7 = 1;
                }
                else {
                  iVar7 = bVar6 - 0xc0;
                  bVar6 = pbVar4[1];
                  pbVar4 = pbVar4 + 2;
                }
              }
              uVar3 = uVar3 - 1;
              iVar7 = iVar7 + -1;
              *pbVar11 = bVar6;
              pbVar11 = pbVar11 + planes;
            } while (uVar3 != 0);
          }
          uVar10 = uVar10 + 1;
          pBVar9 = pBVar9 + 1;
        } while (uVar10 != (uint)planes);
        WVar8 = (this->super_FTexture).Height;
      }
      uVar5 = uVar5 + 1;
      iVar2 = iVar2 + planes;
    } while (uVar5 < WVar8);
  }
  operator_delete__(pbVar1);
  return;
}

Assistant:

void FPCXTexture::ReadPCX24bits (BYTE *dst, FileReader & lump, PCXHeader *hdr, int planes)
{
	int rle_count = 0, rle_value = 0;
	int y, c;
	int bytes;

	BYTE * srcp = new BYTE[lump.GetLength() - sizeof(PCXHeader)];
	lump.Read(srcp, lump.GetLength() - sizeof(PCXHeader));
	BYTE * src = srcp;

	for (y = 0; y < Height; ++y)
	{
		/* for each color plane */
		for (c = 0; c < planes; ++c)
		{
			BYTE * ptr = &dst[y * Width * planes];
			bytes = hdr->bytesPerScanLine;

			while (bytes--)
			{
				if (rle_count == 0)
				{
					if( (rle_value = *src++) < 0xc0)
					{
						rle_count = 1;
					}
					else
					{
						rle_count = rle_value - 0xc0;
						rle_value = *src++;
					}
				}

				rle_count--;
				ptr[c] = (BYTE)rle_value;
				ptr += planes;
			}
		}
	}
	delete [] srcp;
}